

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_lite.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::Generate
          (ImmutableMessageLiteGenerator *this,Printer *printer)

{
  Context **ppCVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  char *pcVar4;
  Context *context;
  long lVar5;
  long *plVar6;
  pointer pcVar7;
  __uniq_ptr_impl<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>
  _Var8;
  bool bVar9;
  int iVar10;
  JavaType type;
  mapped_type *pmVar11;
  LogMessage *pLVar12;
  long *plVar13;
  Descriptor *extraout_RDX;
  Descriptor *extraout_RDX_00;
  ImmutableMessageLiteGenerator *extraout_RDX_01;
  ImmutableMessageLiteGenerator *extraout_RDX_02;
  ImmutableMessageLiteGenerator *extraout_RDX_03;
  size_type sVar14;
  Descriptor *pDVar15;
  long lVar16;
  ImmutableMessageLiteGenerator *pIVar17;
  ImmutableMessageLiteGenerator *extraout_RDX_04;
  char *pcVar18;
  int iVar19;
  uint uVar20;
  OneofDescriptor *oneof;
  long lVar21;
  uint uVar22;
  long lVar23;
  SubstituteArg *in_stack_fffffffffffffd08;
  ImmutableMessageLiteGenerator messageGenerator;
  string out;
  string out_2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  string builder_type;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  variables;
  LogMessage local_198;
  SubstituteArg local_160;
  undefined1 local_130 [32];
  string local_110;
  SubstituteArg local_f0;
  SubstituteArg local_c0;
  SubstituteArg local_90;
  SubstituteArg local_60;
  
  pDVar15 = (this->super_MessageGenerator).descriptor_;
  if (*(long *)(pDVar15 + 0x18) == 0) {
    pcVar18 = " static ";
    if (*(char *)(*(long *)(*(long *)(pDVar15 + 0x10) + 0x88) + 0x98) != '\0') {
      pcVar18 = " ";
    }
  }
  else {
    pcVar18 = " static ";
  }
  variables._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &variables._M_t._M_impl.super__Rb_tree_header._M_header;
  variables._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  variables._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  variables._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  ppCVar1 = &messageGenerator.context_;
  messageGenerator.super_MessageGenerator._vptr_MessageGenerator = (_func_int **)ppCVar1;
  variables._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       variables._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char_const*>((string *)&messageGenerator,"static","");
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&variables,(key_type *)&messageGenerator);
  pcVar4 = (char *)pmVar11->_M_string_length;
  strlen(pcVar18);
  std::__cxx11::string::_M_replace((ulong)pmVar11,0,pcVar4,(ulong)pcVar18);
  if ((Context **)messageGenerator.super_MessageGenerator._vptr_MessageGenerator != ppCVar1) {
    operator_delete(messageGenerator.super_MessageGenerator._vptr_MessageGenerator);
  }
  messageGenerator.super_MessageGenerator._vptr_MessageGenerator = (_func_int **)ppCVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&messageGenerator,"classname","");
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&variables,(key_type *)&messageGenerator);
  std::__cxx11::string::_M_assign((string *)pmVar11);
  pDVar15 = extraout_RDX;
  if ((Context **)messageGenerator.super_MessageGenerator._vptr_MessageGenerator != ppCVar1) {
    operator_delete(messageGenerator.super_MessageGenerator._vptr_MessageGenerator);
    pDVar15 = extraout_RDX_00;
  }
  ExtraMessageInterfaces_abi_cxx11_
            ((string *)&messageGenerator,(java *)(this->super_MessageGenerator).descriptor_,pDVar15)
  ;
  local_198._0_8_ = (pointer)((long)&local_198 + 0x10U);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"extra_interfaces","");
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&variables,(key_type *)&local_198);
  std::__cxx11::string::operator=((string *)pmVar11,(string *)&messageGenerator);
  if ((pointer)local_198._0_8_ != (pointer)((long)&local_198 + 0x10U)) {
    operator_delete((void *)local_198._0_8_);
  }
  if ((Context **)messageGenerator.super_MessageGenerator._vptr_MessageGenerator != ppCVar1) {
    operator_delete(messageGenerator.super_MessageGenerator._vptr_MessageGenerator);
  }
  pcVar18 = "";
  if (*(char *)(*(long *)((this->super_MessageGenerator).descriptor_ + 0x20) + 0x4a) != '\0') {
    pcVar18 = "@java.lang.Deprecated ";
  }
  messageGenerator.super_MessageGenerator._vptr_MessageGenerator = (_func_int **)ppCVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&messageGenerator,"deprecation","");
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&variables,(key_type *)&messageGenerator);
  std::__cxx11::string::_M_replace
            ((ulong)pmVar11,0,(char *)pmVar11->_M_string_length,(ulong)pcVar18);
  if ((Context **)messageGenerator.super_MessageGenerator._vptr_MessageGenerator != ppCVar1) {
    operator_delete(messageGenerator.super_MessageGenerator._vptr_MessageGenerator);
  }
  WriteMessageDocComment(printer,(this->super_MessageGenerator).descriptor_);
  pDVar15 = (this->super_MessageGenerator).descriptor_;
  context = this->context_;
  messageGenerator.super_MessageGenerator._vptr_MessageGenerator = (_func_int **)ppCVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&messageGenerator,"");
  MaybePrintGeneratedAnnotation<google::protobuf::Descriptor_const>
            (context,printer,pDVar15,true,(string *)&messageGenerator);
  if ((Context **)messageGenerator.super_MessageGenerator._vptr_MessageGenerator != ppCVar1) {
    operator_delete(messageGenerator.super_MessageGenerator._vptr_MessageGenerator);
  }
  builder_type._M_dataplus._M_p = (pointer)&builder_type.field_2;
  builder_type._M_string_length = 0;
  builder_type.field_2._M_local_buf[0] = '\0';
  if (*(int *)((this->super_MessageGenerator).descriptor_ + 0x78) < 1) {
    io::Printer::Print(printer,&variables,
                       "$deprecation$public $static$final class $classname$ extends\n    com.google.protobuf.GeneratedMessageLite<\n        $classname$, $classname$.Builder> implements\n    $extra_interfaces$\n    $classname$OrBuilder {\n"
                      );
    std::__cxx11::string::_M_replace
              ((ulong)&builder_type,0,(char *)builder_type._M_string_length,0x3b8c90);
  }
  else {
    io::Printer::Print(printer,&variables,
                       "$deprecation$public $static$final class $classname$ extends\n    com.google.protobuf.GeneratedMessageLite.ExtendableMessage<\n      $classname$, $classname$.Builder> implements\n    $extra_interfaces$\n    $classname$OrBuilder {\n"
                      );
    ClassNameResolver::GetClassName_abi_cxx11_
              ((string *)local_130,this->name_resolver_,(this->super_MessageGenerator).descriptor_,
               true);
    messageGenerator.super_MessageGenerator._vptr_MessageGenerator = (_func_int **)local_130._0_8_;
    messageGenerator.super_MessageGenerator.descriptor_ =
         (Descriptor *)
         CONCAT44(messageGenerator.super_MessageGenerator.descriptor_._4_4_,local_130._8_4_);
    local_198._0_8_ = (pointer)0x0;
    local_198.filename_._0_4_ = -1;
    out._M_dataplus._M_p = (pointer)0x0;
    out._M_string_length = CONCAT44(out._M_string_length._4_4_,0xffffffff);
    vars._M_t._M_impl._0_8_ = 0;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = ~_S_red;
    out_2._M_dataplus._M_p = (pointer)0x0;
    out_2._M_string_length._0_4_ = 0xffffffff;
    local_160.text_ = (char *)0x0;
    local_160.size_ = -1;
    local_60.text_ = (char *)0x0;
    local_60.size_ = -1;
    local_90.text_ = (char *)0x0;
    local_90.size_ = -1;
    local_c0.text_ = (char *)0x0;
    local_c0.size_ = -1;
    local_f0.text_ = (char *)0x0;
    local_f0.size_ = -1;
    strings::Substitute_abi_cxx11_
              (&local_110,
               (strings *)"com.google.protobuf.GeneratedMessageLite.ExtendableBuilder<$0, ?>",
               (char *)&messageGenerator,(SubstituteArg *)&local_198,(SubstituteArg *)&out,
               (SubstituteArg *)&vars,(SubstituteArg *)&out_2,&local_160,&local_60,&local_90,
               &local_c0,&local_f0,in_stack_fffffffffffffd08);
    std::__cxx11::string::operator=((string *)&builder_type,(string *)&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
      operator_delete((void *)local_130._0_8_);
    }
  }
  io::Printer::Indent(printer);
  GenerateConstructor(this,printer);
  pDVar15 = (this->super_MessageGenerator).descriptor_;
  if (0 < *(int *)(pDVar15 + 0x74)) {
    lVar21 = 0;
    lVar23 = 0;
    do {
      EnumLiteGenerator::EnumLiteGenerator
                ((EnumLiteGenerator *)&messageGenerator,
                 (EnumDescriptor *)(*(long *)(pDVar15 + 0x40) + lVar21),true,this->context_);
      EnumLiteGenerator::Generate((EnumLiteGenerator *)&messageGenerator,printer);
      EnumLiteGenerator::~EnumLiteGenerator((EnumLiteGenerator *)&messageGenerator);
      lVar23 = lVar23 + 1;
      pDVar15 = (this->super_MessageGenerator).descriptor_;
      lVar21 = lVar21 + 0x50;
    } while (lVar23 < *(int *)(pDVar15 + 0x74));
  }
  pDVar15 = (this->super_MessageGenerator).descriptor_;
  pIVar17 = this;
  if (0 < *(int *)(pDVar15 + 0x70)) {
    lVar21 = 0;
    lVar23 = 0;
    do {
      if (*(char *)(*(long *)(*(long *)(pDVar15 + 0x38) + 0x20 + lVar21) + 0x4b) == '\0') {
        ImmutableMessageLiteGenerator
                  (&messageGenerator,(Descriptor *)(*(long *)(pDVar15 + 0x38) + lVar21),
                   this->context_);
        GenerateInterface(&messageGenerator,printer);
        Generate(&messageGenerator,printer);
        messageGenerator.super_MessageGenerator._vptr_MessageGenerator =
             (_func_int **)&PTR__ImmutableMessageLiteGenerator_0046eaf0;
        FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::
        ~FieldGeneratorMap(&messageGenerator.field_generators_);
        MessageGenerator::~MessageGenerator(&messageGenerator.super_MessageGenerator);
        pIVar17 = extraout_RDX_01;
      }
      lVar23 = lVar23 + 1;
      pDVar15 = (this->super_MessageGenerator).descriptor_;
      lVar21 = lVar21 + 0x90;
    } while (lVar23 < *(int *)(pDVar15 + 0x70));
  }
  pDVar15 = (this->super_MessageGenerator).descriptor_;
  if (*(int *)(pDVar15 + 0x68) < 1) {
    iVar19 = 0;
  }
  else {
    lVar23 = 0;
    lVar21 = 0;
    iVar19 = 0;
    do {
      lVar16 = *(long *)(pDVar15 + 0x28);
      if (*(Descriptor **)(lVar16 + 0x50 + lVar23) != (this->field_generators_).descriptor_) {
        internal::LogMessage::LogMessage
                  (&local_198,LOGLEVEL_FATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/java/java_field.h"
                   ,0x87);
        pLVar12 = internal::LogMessage::operator<<
                            (&local_198,
                             "CHECK failed: (field->containing_type()) == (descriptor_): ");
        internal::LogFinisher::operator=((LogFinisher *)&messageGenerator,pLVar12);
        internal::LogMessage::~LogMessage(&local_198);
      }
      if (*(char *)(lVar16 + 0x42 + lVar23) == '\0') {
        plVar13 = (long *)(*(long *)(lVar16 + 0x50 + lVar23) + 0x28);
      }
      else {
        lVar5 = *(long *)(lVar16 + 0x60 + lVar23);
        if (lVar5 == 0) {
          plVar13 = (long *)(*(long *)(lVar16 + 0x28 + lVar23) + 0x80);
        }
        else {
          plVar13 = (long *)(lVar5 + 0x50);
        }
      }
      iVar10 = (**(code **)(*(long *)(this->field_generators_).field_generators_.
                                     super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start
                                     [(int)((ulong)((lVar16 - *plVar13) + lVar23) >> 3) * 0x286bca1b
                                     ]._M_t.
                                     super___uniq_ptr_impl<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>
                                     ._M_t + 0x10))();
      iVar19 = iVar19 + iVar10;
      lVar21 = lVar21 + 1;
      pDVar15 = (this->super_MessageGenerator).descriptor_;
      lVar23 = lVar23 + 0x98;
      pIVar17 = this;
    } while (lVar21 < *(int *)(pDVar15 + 0x68));
  }
  if (0 < iVar19) {
    uVar20 = iVar19 + 0x1fU >> 5;
    uVar22 = 1;
    if (1 < uVar20) {
      uVar22 = uVar20;
    }
    uVar20 = 0;
    do {
      GetBitFieldName_abi_cxx11_((string *)&messageGenerator,(java *)(ulong)uVar20,(int)pIVar17);
      io::Printer::Print<char[15],std::__cxx11::string>
                (printer,"private int $bit_field_name$;\n",(char (*) [15])"bit_field_name",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &messageGenerator);
      pIVar17 = extraout_RDX_02;
      if ((Context **)messageGenerator.super_MessageGenerator._vptr_MessageGenerator !=
          &messageGenerator.context_) {
        operator_delete(messageGenerator.super_MessageGenerator._vptr_MessageGenerator);
        pIVar17 = extraout_RDX_03;
      }
      uVar20 = uVar20 + 1;
    } while (uVar22 != uVar20);
  }
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &vars._M_t._M_impl.super__Rb_tree_header._M_header;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pDVar15 = (this->super_MessageGenerator).descriptor_;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (0 < *(int *)(pDVar15 + 0x6c)) {
    paVar2 = &out.field_2;
    paVar3 = &out_2.field_2;
    lVar21 = 0;
    do {
      oneof = (OneofDescriptor *)(lVar21 * 0x30 + *(long *)(pDVar15 + 0x30));
      Context::GetOneofGeneratorInfo(this->context_,oneof);
      messageGenerator.super_MessageGenerator._vptr_MessageGenerator =
           (_func_int **)&messageGenerator.context_;
      std::__cxx11::string::_M_construct<char_const*>((string *)&messageGenerator,"oneof_name","");
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&vars,(key_type *)&messageGenerator);
      std::__cxx11::string::_M_assign((string *)pmVar11);
      if ((Context **)messageGenerator.super_MessageGenerator._vptr_MessageGenerator !=
          &messageGenerator.context_) {
        operator_delete(messageGenerator.super_MessageGenerator._vptr_MessageGenerator);
      }
      Context::GetOneofGeneratorInfo(this->context_,oneof);
      messageGenerator.super_MessageGenerator._vptr_MessageGenerator =
           (_func_int **)&messageGenerator.context_;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&messageGenerator,"oneof_capitalized_name","");
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&vars,(key_type *)&messageGenerator);
      std::__cxx11::string::_M_assign((string *)pmVar11);
      if ((Context **)messageGenerator.super_MessageGenerator._vptr_MessageGenerator !=
          &messageGenerator.context_) {
        operator_delete(messageGenerator.super_MessageGenerator._vptr_MessageGenerator);
      }
      ppCVar1 = &messageGenerator.context_;
      messageGenerator.super_MessageGenerator._vptr_MessageGenerator = (_func_int **)ppCVar1;
      pcVar18 = FastInt32ToBufferLeft
                          ((int)((ulong)((long)oneof - *(long *)(*(long *)(oneof + 0x10) + 0x30)) >>
                                4) * -0x55555555,(char *)ppCVar1);
      messageGenerator.super_MessageGenerator.descriptor_ = (Descriptor *)(pcVar18 + -(long)ppCVar1)
      ;
      out._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&out,messageGenerator.super_MessageGenerator._vptr_MessageGenerator,
                 messageGenerator.super_MessageGenerator.descriptor_ +
                 (long)messageGenerator.super_MessageGenerator._vptr_MessageGenerator);
      out_2._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&out_2,"oneof_index","");
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&vars,&out_2);
      std::__cxx11::string::operator=((string *)pmVar11,(string *)&out);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)out_2._M_dataplus._M_p != paVar3) {
        operator_delete(out_2._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)out._M_dataplus._M_p != paVar2) {
        operator_delete(out._M_dataplus._M_p);
      }
      io::Printer::Print(printer,&vars,
                         "private int $oneof_name$Case_ = 0;\nprivate java.lang.Object $oneof_name$_;\n"
                        );
      io::Printer::Print(printer,&vars,"public enum $oneof_capitalized_name$Case {\n");
      io::Printer::Indent(printer);
      if (0 < *(int *)(oneof + 0x18)) {
        lVar23 = 0;
        do {
          plVar13 = *(long **)(*(long *)(oneof + 0x20) + lVar23 * 8);
          plVar6 = (long *)*plVar13;
          lVar16 = *plVar6;
          out._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char*>((string *)&out,lVar16,plVar6[1] + lVar16);
          if (out._M_string_length != 0) {
            sVar14 = 0;
            do {
              if ((byte)(out._M_dataplus._M_p[sVar14] + 0x9fU) < 0x1a) {
                out._M_dataplus._M_p[sVar14] = out._M_dataplus._M_p[sVar14] + -0x20;
              }
              sVar14 = sVar14 + 1;
            } while (out._M_string_length != sVar14);
          }
          ppCVar1 = &messageGenerator.context_;
          messageGenerator.super_MessageGenerator._vptr_MessageGenerator = (_func_int **)ppCVar1;
          pcVar18 = FastInt32ToBufferLeft(*(int32 *)((long)plVar13 + 0x44),(char *)ppCVar1);
          messageGenerator.super_MessageGenerator.descriptor_ =
               (Descriptor *)(pcVar18 + -(long)ppCVar1);
          out_2._M_dataplus._M_p = (pointer)paVar3;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&out_2,messageGenerator.super_MessageGenerator._vptr_MessageGenerator
                     ,messageGenerator.super_MessageGenerator.descriptor_ +
                      (long)messageGenerator.super_MessageGenerator._vptr_MessageGenerator);
          io::Printer::Print<char[11],std::__cxx11::string,char[13],std::__cxx11::string>
                    (printer,"$field_name$($field_number$),\n",(char (*) [11])0x3b3b74,&out,
                     (char (*) [13])"field_number",&out_2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)out_2._M_dataplus._M_p != paVar3) {
            operator_delete(out_2._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)out._M_dataplus._M_p != paVar2) {
            operator_delete(out._M_dataplus._M_p);
          }
          lVar23 = lVar23 + 1;
        } while (lVar23 < *(int *)(oneof + 0x18));
      }
      out._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&out,"oneof_name","");
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&vars,&out);
      messageGenerator.super_MessageGenerator._vptr_MessageGenerator =
           (_func_int **)&messageGenerator.context_;
      pcVar7 = (pmVar11->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&messageGenerator,pcVar7,pcVar7 + pmVar11->_M_string_length);
      if (messageGenerator.super_MessageGenerator.descriptor_ != (Descriptor *)0x0) {
        pDVar15 = (Descriptor *)0x0;
        do {
          if ((byte)((char)*(Descriptor *)
                            ((long)messageGenerator.super_MessageGenerator._vptr_MessageGenerator +
                            (long)pDVar15) + 0x9fU) < 0x1a) {
            *(char *)((long)messageGenerator.super_MessageGenerator._vptr_MessageGenerator +
                     (long)pDVar15) =
                 (char)*(Descriptor *)
                        ((long)messageGenerator.super_MessageGenerator._vptr_MessageGenerator +
                        (long)pDVar15) + -0x20;
          }
          pDVar15 = pDVar15 + 1;
        } while (messageGenerator.super_MessageGenerator.descriptor_ != pDVar15);
      }
      io::Printer::Print<char[15],std::__cxx11::string>
                (printer,"$cap_oneof_name$_NOT_SET(0);\n",(char (*) [15])"cap_oneof_name",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &messageGenerator);
      if ((Context **)messageGenerator.super_MessageGenerator._vptr_MessageGenerator !=
          &messageGenerator.context_) {
        operator_delete(messageGenerator.super_MessageGenerator._vptr_MessageGenerator);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)out._M_dataplus._M_p != paVar2) {
        operator_delete(out._M_dataplus._M_p);
      }
      io::Printer::Print(printer,&vars,
                         "private final int value;\nprivate $oneof_capitalized_name$Case(int value) {\n  this.value = value;\n}\n"
                        );
      io::Printer::Print(printer,&vars,
                         "/**\n * @deprecated Use {@link #forNumber(int)} instead.\n */\n@java.lang.Deprecated\npublic static $oneof_capitalized_name$Case valueOf(int value) {\n  return forNumber(value);\n}\n\npublic static $oneof_capitalized_name$Case forNumber(int value) {\n  switch (value) {\n"
                        );
      if (0 < *(int *)(oneof + 0x18)) {
        lVar23 = 0;
        do {
          plVar13 = *(long **)(*(long *)(oneof + 0x20) + lVar23 * 8);
          ppCVar1 = &messageGenerator.context_;
          messageGenerator.super_MessageGenerator._vptr_MessageGenerator = (_func_int **)ppCVar1;
          pcVar18 = FastInt32ToBufferLeft(*(int32 *)((long)plVar13 + 0x44),(char *)ppCVar1);
          messageGenerator.super_MessageGenerator.descriptor_ =
               (Descriptor *)(pcVar18 + -(long)ppCVar1);
          out._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&out,messageGenerator.super_MessageGenerator._vptr_MessageGenerator,
                     messageGenerator.super_MessageGenerator.descriptor_ +
                     (long)messageGenerator.super_MessageGenerator._vptr_MessageGenerator);
          plVar13 = (long *)*plVar13;
          lVar16 = *plVar13;
          out_2._M_dataplus._M_p = (pointer)paVar3;
          std::__cxx11::string::_M_construct<char*>((string *)&out_2,lVar16,plVar13[1] + lVar16);
          if (CONCAT44(out_2._M_string_length._4_4_,(undefined4)out_2._M_string_length) != 0) {
            lVar16 = 0;
            do {
              if ((byte)(out_2._M_dataplus._M_p[lVar16] + 0x9fU) < 0x1a) {
                out_2._M_dataplus._M_p[lVar16] = out_2._M_dataplus._M_p[lVar16] + -0x20;
              }
              lVar16 = lVar16 + 1;
            } while (CONCAT44(out_2._M_string_length._4_4_,(undefined4)out_2._M_string_length) !=
                     lVar16);
          }
          io::Printer::Print<char[13],std::__cxx11::string,char[11],std::__cxx11::string>
                    (printer,"    case $field_number$: return $field_name$;\n",
                     (char (*) [13])"field_number",&out,(char (*) [11])0x3b3b74,&out_2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)out_2._M_dataplus._M_p != paVar3) {
            operator_delete(out_2._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)out._M_dataplus._M_p != paVar2) {
            operator_delete(out._M_dataplus._M_p);
          }
          lVar23 = lVar23 + 1;
        } while (lVar23 < *(int *)(oneof + 0x18));
      }
      out._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&out,"oneof_name","");
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&vars,&out);
      messageGenerator.super_MessageGenerator._vptr_MessageGenerator =
           (_func_int **)&messageGenerator.context_;
      pcVar7 = (pmVar11->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&messageGenerator,pcVar7,pcVar7 + pmVar11->_M_string_length);
      if (messageGenerator.super_MessageGenerator.descriptor_ != (Descriptor *)0x0) {
        pDVar15 = (Descriptor *)0x0;
        do {
          if ((byte)((char)*(Descriptor *)
                            ((long)messageGenerator.super_MessageGenerator._vptr_MessageGenerator +
                            (long)pDVar15) + 0x9fU) < 0x1a) {
            *(char *)((long)messageGenerator.super_MessageGenerator._vptr_MessageGenerator +
                     (long)pDVar15) =
                 (char)*(Descriptor *)
                        ((long)messageGenerator.super_MessageGenerator._vptr_MessageGenerator +
                        (long)pDVar15) + -0x20;
          }
          pDVar15 = pDVar15 + 1;
        } while (messageGenerator.super_MessageGenerator.descriptor_ != pDVar15);
      }
      io::Printer::Print<char[15],std::__cxx11::string>
                (printer,
                 "    case 0: return $cap_oneof_name$_NOT_SET;\n    default: return null;\n  }\n}\npublic int getNumber() {\n  return this.value;\n}\n"
                 ,(char (*) [15])"cap_oneof_name",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &messageGenerator);
      if ((Context **)messageGenerator.super_MessageGenerator._vptr_MessageGenerator !=
          &messageGenerator.context_) {
        operator_delete(messageGenerator.super_MessageGenerator._vptr_MessageGenerator);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)out._M_dataplus._M_p != paVar2) {
        operator_delete(out._M_dataplus._M_p);
      }
      io::Printer::Outdent(printer);
      io::Printer::Print<>(printer,"};\n\n");
      io::Printer::Print(printer,&vars,
                         "@java.lang.Override\npublic $oneof_capitalized_name$Case\nget$oneof_capitalized_name$Case() {\n  return $oneof_capitalized_name$Case.forNumber(\n      $oneof_name$Case_);\n}\n\nprivate void clear$oneof_capitalized_name$() {\n  $oneof_name$Case_ = 0;\n  $oneof_name$_ = null;\n}\n\n"
                        );
      lVar21 = lVar21 + 1;
      pDVar15 = (this->super_MessageGenerator).descriptor_;
    } while (lVar21 < *(int *)(pDVar15 + 0x6c));
  }
  pDVar15 = (this->super_MessageGenerator).descriptor_;
  if (0 < *(int *)(pDVar15 + 0x68)) {
    paVar2 = &out.field_2;
    lVar23 = 0;
    lVar21 = 0;
    pIVar17 = this;
    do {
      FieldConstantName_abi_cxx11_
                (&out_2,(java *)(*(long *)(pDVar15 + 0x28) + lVar23),(FieldDescriptor *)pIVar17);
      out._M_dataplus._M_p = (pointer)paVar2;
      pcVar18 = FastInt32ToBufferLeft
                          (*(int32 *)(*(long *)((this->super_MessageGenerator).descriptor_ + 0x28) +
                                      0x44 + lVar23),paVar2->_M_local_buf);
      out._M_string_length = (long)pcVar18 - (long)paVar2;
      local_160.text_ = local_160.scratch_ + 4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_160,out._M_dataplus._M_p,
                 out._M_dataplus._M_p + out._M_string_length);
      io::Printer::Print<char[14],std::__cxx11::string,char[7],std::__cxx11::string>
                (printer,"public static final int $constant_name$ = $number$;\n",
                 (char (*) [14])0x3b1108,&out_2,(char (*) [7])0x3b3c9d,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_160);
      if (local_160.text_ != local_160.scratch_ + 4) {
        operator_delete(local_160.text_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)out_2._M_dataplus._M_p != &out_2.field_2) {
        operator_delete(out_2._M_dataplus._M_p);
      }
      lVar16 = *(long *)((this->super_MessageGenerator).descriptor_ + 0x28);
      if (*(Descriptor **)(lVar16 + 0x50 + lVar23) != (this->field_generators_).descriptor_) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)&messageGenerator,LOGLEVEL_FATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/java/java_field.h"
                   ,0x87);
        pLVar12 = internal::LogMessage::operator<<
                            ((LogMessage *)&messageGenerator,
                             "CHECK failed: (field->containing_type()) == (descriptor_): ");
        internal::LogFinisher::operator=((LogFinisher *)&out,pLVar12);
        internal::LogMessage::~LogMessage((LogMessage *)&messageGenerator);
      }
      if (*(char *)(lVar16 + 0x42 + lVar23) == '\0') {
        plVar13 = (long *)(*(long *)(lVar16 + 0x50 + lVar23) + 0x28);
      }
      else {
        lVar5 = *(long *)(lVar16 + 0x60 + lVar23);
        if (lVar5 == 0) {
          plVar13 = (long *)(*(long *)(lVar16 + 0x28 + lVar23) + 0x80);
        }
        else {
          plVar13 = (long *)(lVar5 + 0x50);
        }
      }
      _Var8._M_t.
      super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>
      .super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_false>
      ._M_head_impl =
           (this->field_generators_).field_generators_.
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start
           [(int)((ulong)((lVar16 - *plVar13) + lVar23) >> 3) * 0x286bca1b]._M_t.
           super___uniq_ptr_impl<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>
           ._M_t;
      (**(code **)(*(long *)_Var8._M_t.
                            super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>
                            .
                            super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_false>
                            ._M_head_impl + 0x20))
                (_Var8._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>
                 .
                 super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_false>
                 ._M_head_impl,printer);
      io::Printer::Print<>(printer,"\n");
      lVar21 = lVar21 + 1;
      pDVar15 = (this->super_MessageGenerator).descriptor_;
      lVar23 = lVar23 + 0x98;
      pIVar17 = extraout_RDX_04;
    } while (lVar21 < *(int *)(pDVar15 + 0x68));
  }
  GenerateParseFromMethods(this,printer);
  GenerateBuilder(this,printer);
  bVar9 = HasRequiredFields((this->super_MessageGenerator).descriptor_);
  if (bVar9) {
    io::Printer::Print<>(printer,"private byte memoizedIsInitialized = 2;\n");
  }
  ClassNameResolver::GetClassName_abi_cxx11_
            (&out,this->name_resolver_,(this->super_MessageGenerator).descriptor_,true);
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,
             "@java.lang.Override\n@java.lang.SuppressWarnings({\"unchecked\", \"fallthrough\"})\nprotected final java.lang.Object dynamicMethod(\n    com.google.protobuf.GeneratedMessageLite.MethodToInvoke method,\n    java.lang.Object arg0, java.lang.Object arg1) {\n  switch (method) {\n    case NEW_MUTABLE_INSTANCE: {\n      return new $classname$();\n    }\n"
             ,(char (*) [10])0x3aca6c,&out);
  paVar2 = &out.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)out._M_dataplus._M_p != paVar2) {
    operator_delete(out._M_dataplus._M_p);
  }
  io::Printer::Indent(printer);
  io::Printer::Indent(printer);
  io::Printer::Print<>(printer,"case NEW_BUILDER: {\n");
  io::Printer::Indent(printer);
  io::Printer::Print<>(printer,"return new Builder();\n");
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"}\ncase BUILD_MESSAGE_INFO: {\n");
  io::Printer::Indent(printer);
  GenerateDynamicMethodNewBuildMessageInfo(this,printer);
  io::Printer::Outdent(printer);
  ClassNameResolver::GetClassName_abi_cxx11_
            (&out,this->name_resolver_,(this->super_MessageGenerator).descriptor_,true);
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,
             "}\n// fall through\ncase GET_DEFAULT_INSTANCE: {\n  return DEFAULT_INSTANCE;\n}\ncase GET_PARSER: {\n  com.google.protobuf.Parser<$classname$> parser = PARSER;\n  if (parser == null) {\n    synchronized ($classname$.class) {\n      parser = PARSER;\n      if (parser == null) {\n        parser =\n            new DefaultInstanceBasedParser<$classname$>(\n                DEFAULT_INSTANCE);\n        PARSER = parser;\n      }\n    }\n  }\n  return parser;\n"
             ,(char (*) [10])0x3aca6c,&out);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)out._M_dataplus._M_p != paVar2) {
    operator_delete(out._M_dataplus._M_p);
  }
  io::Printer::Outdent(printer);
  bVar9 = HasRequiredFields((this->super_MessageGenerator).descriptor_);
  pcVar18 = 
  "}\ncase GET_MEMOIZED_IS_INITIALIZED: {\n  return (byte) 1;\n}\ncase SET_MEMOIZED_IS_INITIALIZED: {\n  return null;\n}\n"
  ;
  if (bVar9) {
    pcVar18 = 
    "}\ncase GET_MEMOIZED_IS_INITIALIZED: {\n  return memoizedIsInitialized;\n}\ncase SET_MEMOIZED_IS_INITIALIZED: {\n  memoizedIsInitialized = (byte) (arg0 == null ? 0 : 1);\n  return null;\n}\n"
    ;
  }
  io::Printer::Print<>(printer,pcVar18);
  io::Printer::Outdent(printer);
  ClassNameResolver::GetClassName_abi_cxx11_
            (&out,this->name_resolver_,(this->super_MessageGenerator).descriptor_,true);
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,"  }\n  throw new UnsupportedOperationException();\n}\n\n",
             (char (*) [10])0x3aca6c,&out);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)out._M_dataplus._M_p != paVar2) {
    operator_delete(out._M_dataplus._M_p);
  }
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,"\n// @@protoc_insertion_point(class_scope:$full_name$)\n",
             (char (*) [10])0x3ab1b1,
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
              ((this->super_MessageGenerator).descriptor_ + 8));
  ClassNameResolver::GetClassName_abi_cxx11_
            (&out,this->name_resolver_,(this->super_MessageGenerator).descriptor_,true);
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,"private static final $classname$ DEFAULT_INSTANCE;\n",(char (*) [10])0x3aca6c,
             &out);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)out._M_dataplus._M_p != paVar2) {
    operator_delete(out._M_dataplus._M_p);
  }
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,
             "static {\n  $classname$ defaultInstance = new $classname$();\n  // New instances are implicitly immutable so no need to make\n  // immutable.\n  DEFAULT_INSTANCE = defaultInstance;\n  com.google.protobuf.GeneratedMessageLite.registerDefaultInstance(\n    $classname$.class, defaultInstance);\n}\n\n"
             ,(char (*) [10])0x3aca6c,
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
              (this->super_MessageGenerator).descriptor_);
  ClassNameResolver::GetClassName_abi_cxx11_
            (&out,this->name_resolver_,(this->super_MessageGenerator).descriptor_,true);
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,
             "public static $classname$ getDefaultInstance() {\n  return DEFAULT_INSTANCE;\n}\n\n",
             (char (*) [10])0x3aca6c,&out);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)out._M_dataplus._M_p != paVar2) {
    operator_delete(out._M_dataplus._M_p);
  }
  iVar19 = std::__cxx11::string::compare
                     ((char *)**(undefined8 **)((this->super_MessageGenerator).descriptor_ + 0x10));
  if (iVar19 == 0) {
    ClassNameResolver::GetClassName_abi_cxx11_
              (&out,this->name_resolver_,(this->super_MessageGenerator).descriptor_,true);
    type = GetJavaType(*(FieldDescriptor **)((this->super_MessageGenerator).descriptor_ + 0x28));
    out_2._M_dataplus._M_p = PrimitiveTypeName(type);
    io::Printer::Print<char[10],std::__cxx11::string,char[11],char_const*>
              (printer,
               "public static $classname$ of($field_type$ value) {\n  return newBuilder().setValue(value).build();\n}\n\n"
               ,(char (*) [10])0x3aca6c,&out,(char (*) [11])0x3c3190,(char **)&out_2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)out._M_dataplus._M_p != paVar2) {
      operator_delete(out._M_dataplus._M_p);
    }
  }
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,
             "private static volatile com.google.protobuf.Parser<$classname$> PARSER;\n\npublic static com.google.protobuf.Parser<$classname$> parser() {\n  return DEFAULT_INSTANCE.getParserForType();\n}\n"
             ,(char (*) [10])0x3aca6c,
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
              (this->super_MessageGenerator).descriptor_);
  pDVar15 = (this->super_MessageGenerator).descriptor_;
  if (0 < *(int *)(pDVar15 + 0x7c)) {
    lVar21 = 0;
    lVar23 = 0;
    do {
      ImmutableExtensionLiteGenerator::ImmutableExtensionLiteGenerator
                ((ImmutableExtensionLiteGenerator *)&out,
                 (FieldDescriptor *)(*(long *)(pDVar15 + 0x50) + lVar21),this->context_);
      ImmutableExtensionLiteGenerator::Generate((ImmutableExtensionLiteGenerator *)&out,printer);
      ImmutableExtensionLiteGenerator::~ImmutableExtensionLiteGenerator
                ((ImmutableExtensionLiteGenerator *)&out);
      lVar23 = lVar23 + 1;
      pDVar15 = (this->super_MessageGenerator).descriptor_;
      lVar21 = lVar21 + 0x98;
    } while (lVar23 < *(int *)(pDVar15 + 0x7c));
  }
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"}\n\n");
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&vars._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)builder_type._M_dataplus._M_p != &builder_type.field_2) {
    operator_delete(builder_type._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&variables._M_t);
  return;
}

Assistant:

void ImmutableMessageLiteGenerator::Generate(io::Printer* printer) {
  bool is_own_file = IsOwnFile(descriptor_, /* immutable = */ true);

  std::map<std::string, std::string> variables;
  variables["static"] = is_own_file ? " " : " static ";
  variables["classname"] = descriptor_->name();
  variables["extra_interfaces"] = ExtraMessageInterfaces(descriptor_);
  variables["deprecation"] =
      descriptor_->options().deprecated() ? "@java.lang.Deprecated " : "";

  WriteMessageDocComment(printer, descriptor_);
  MaybePrintGeneratedAnnotation(context_, printer, descriptor_,
                                /* immutable = */ true);


  // The builder_type stores the super type name of the nested Builder class.
  std::string builder_type;
  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
        variables,
        "$deprecation$public $static$final class $classname$ extends\n"
        "    com.google.protobuf.GeneratedMessageLite.ExtendableMessage<\n"
        "      $classname$, $classname$.Builder> implements\n"
        "    $extra_interfaces$\n"
        "    $classname$OrBuilder {\n");
    builder_type = strings::Substitute(
        "com.google.protobuf.GeneratedMessageLite.ExtendableBuilder<$0, ?>",
        name_resolver_->GetImmutableClassName(descriptor_));
  } else {
    printer->Print(
        variables,
        "$deprecation$public $static$final class $classname$ extends\n"
        "    com.google.protobuf.GeneratedMessageLite<\n"
        "        $classname$, $classname$.Builder> implements\n"
        "    $extra_interfaces$\n"
        "    $classname$OrBuilder {\n");

    builder_type = "com.google.protobuf.GeneratedMessageLite.Builder";
  }
  printer->Indent();

  GenerateConstructor(printer);

  // Nested types
  for (int i = 0; i < descriptor_->enum_type_count(); i++) {
    EnumLiteGenerator(descriptor_->enum_type(i), true, context_)
        .Generate(printer);
  }

  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    // Don't generate Java classes for map entry messages.
    if (IsMapEntry(descriptor_->nested_type(i))) continue;
    ImmutableMessageLiteGenerator messageGenerator(descriptor_->nested_type(i),
                                                   context_);
    messageGenerator.GenerateInterface(printer);
    messageGenerator.Generate(printer);
  }

  // Integers for bit fields.
  int totalBits = 0;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    totalBits +=
        field_generators_.get(descriptor_->field(i)).GetNumBitsForMessage();
  }
  int totalInts = (totalBits + 31) / 32;
  for (int i = 0; i < totalInts; i++) {
    printer->Print("private int $bit_field_name$;\n", "bit_field_name",
                   GetBitFieldName(i));
  }

  // oneof
  std::map<std::string, std::string> vars;
  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    const OneofDescriptor* oneof = descriptor_->oneof_decl(i);
    vars["oneof_name"] = context_->GetOneofGeneratorInfo(oneof)->name;
    vars["oneof_capitalized_name"] =
        context_->GetOneofGeneratorInfo(oneof)->capitalized_name;
    vars["oneof_index"] = StrCat(oneof->index());
    // oneofCase_ and oneof_
    printer->Print(vars,
                   "private int $oneof_name$Case_ = 0;\n"
                   "private java.lang.Object $oneof_name$_;\n");
    // OneofCase enum
    printer->Print(vars, "public enum $oneof_capitalized_name$Case {\n");
    printer->Indent();
    for (int j = 0; j < oneof->field_count(); j++) {
      const FieldDescriptor* field = oneof->field(j);
      printer->Print("$field_name$($field_number$),\n", "field_name",
                     ToUpper(field->name()), "field_number",
                     StrCat(field->number()));
    }
    printer->Print("$cap_oneof_name$_NOT_SET(0);\n", "cap_oneof_name",
                   ToUpper(vars["oneof_name"]));
    printer->Print(vars,
                   "private final int value;\n"
                   "private $oneof_capitalized_name$Case(int value) {\n"
                   "  this.value = value;\n"
                   "}\n");
    printer->Print(
        vars,
        "/**\n"
        " * @deprecated Use {@link #forNumber(int)} instead.\n"
        " */\n"
        "@java.lang.Deprecated\n"
        "public static $oneof_capitalized_name$Case valueOf(int value) {\n"
        "  return forNumber(value);\n"
        "}\n"
        "\n"
        "public static $oneof_capitalized_name$Case forNumber(int value) {\n"
        "  switch (value) {\n");
    for (int j = 0; j < oneof->field_count(); j++) {
      const FieldDescriptor* field = oneof->field(j);
      printer->Print("    case $field_number$: return $field_name$;\n",
                     "field_number", StrCat(field->number()),
                     "field_name", ToUpper(field->name()));
    }
    printer->Print(
        "    case 0: return $cap_oneof_name$_NOT_SET;\n"
        "    default: return null;\n"
        "  }\n"
        "}\n"
        // TODO(b/135620659): Rename this to "getFieldNumber" or something to
        // disambiguate it from actual proto enums.
        "public int getNumber() {\n"
        "  return this.value;\n"
        "}\n",
        "cap_oneof_name", ToUpper(vars["oneof_name"]));
    printer->Outdent();
    printer->Print("};\n\n");
    // oneofCase()
    printer->Print(vars,
                   "@java.lang.Override\n"
                   "public $oneof_capitalized_name$Case\n"
                   "get$oneof_capitalized_name$Case() {\n"
                   "  return $oneof_capitalized_name$Case.forNumber(\n"
                   "      $oneof_name$Case_);\n"
                   "}\n"
                   "\n"
                   "private void clear$oneof_capitalized_name$() {\n"
                   "  $oneof_name$Case_ = 0;\n"
                   "  $oneof_name$_ = null;\n"
                   "}\n"
                   "\n");
  }

  // Fields
  for (int i = 0; i < descriptor_->field_count(); i++) {
    printer->Print("public static final int $constant_name$ = $number$;\n",
                   "constant_name", FieldConstantName(descriptor_->field(i)),
                   "number", StrCat(descriptor_->field(i)->number()));
    field_generators_.get(descriptor_->field(i)).GenerateMembers(printer);
    printer->Print("\n");
  }

  GenerateParseFromMethods(printer);
  GenerateBuilder(printer);

  if (HasRequiredFields(descriptor_)) {
    // Memoizes whether the protocol buffer is fully initialized (has all
    // required fields). 0 means false, 1 means true, and all other values
    // mean not yet computed.
    printer->Print("private byte memoizedIsInitialized = 2;\n");
  }

  printer->Print(
      "@java.lang.Override\n"
      "@java.lang.SuppressWarnings({\"unchecked\", \"fallthrough\"})\n"
      "protected final java.lang.Object dynamicMethod(\n"
      "    com.google.protobuf.GeneratedMessageLite.MethodToInvoke method,\n"
      "    java.lang.Object arg0, java.lang.Object arg1) {\n"
      "  switch (method) {\n"
      "    case NEW_MUTABLE_INSTANCE: {\n"
      "      return new $classname$();\n"
      "    }\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  printer->Indent();
  printer->Indent();

  printer->Print("case NEW_BUILDER: {\n");

  printer->Indent();
  GenerateDynamicMethodNewBuilder(printer);
  printer->Outdent();

  printer->Print(
      "}\n"
      "case BUILD_MESSAGE_INFO: {\n");

  printer->Indent();
  GenerateDynamicMethodNewBuildMessageInfo(printer);
  printer->Outdent();

  printer->Print(
      "}\n"
      "// fall through\n"
      "case GET_DEFAULT_INSTANCE: {\n"
      "  return DEFAULT_INSTANCE;\n"
      "}\n"
      "case GET_PARSER: {\n"
      // Generally one would use the lazy initialization holder pattern for
      // manipulating static fields but that has exceptional cost on Android as
      // it will generate an extra class for every message. Instead, use the
      // double-check locking pattern which works just as well.
      //
      // The "parser" temporary mirrors the "PARSER" field to eliminate a read
      // at the final return statement.
      "  com.google.protobuf.Parser<$classname$> parser = PARSER;\n"
      "  if (parser == null) {\n"
      "    synchronized ($classname$.class) {\n"
      "      parser = PARSER;\n"
      "      if (parser == null) {\n"
      "        parser =\n"
      "            new DefaultInstanceBasedParser<$classname$>(\n"
      "                DEFAULT_INSTANCE);\n"
      "        PARSER = parser;\n"
      "      }\n"
      "    }\n"
      "  }\n"
      "  return parser;\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  printer->Outdent();

  if (HasRequiredFields(descriptor_)) {
    printer->Print(
        "}\n"
        "case GET_MEMOIZED_IS_INITIALIZED: {\n"
        "  return memoizedIsInitialized;\n"
        "}\n"
        "case SET_MEMOIZED_IS_INITIALIZED: {\n"
        "  memoizedIsInitialized = (byte) (arg0 == null ? 0 : 1);\n"
        "  return null;\n"
        "}\n");
  } else {
    printer->Print(
        "}\n"
        "case GET_MEMOIZED_IS_INITIALIZED: {\n"
        "  return (byte) 1;\n"
        "}\n"
        "case SET_MEMOIZED_IS_INITIALIZED: {\n"
        "  return null;\n"
        "}\n");
  }

  printer->Outdent();
  printer->Print(
      "  }\n"
      "  throw new UnsupportedOperationException();\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  printer->Print(
      "\n"
      "// @@protoc_insertion_point(class_scope:$full_name$)\n",
      "full_name", descriptor_->full_name());

  // Carefully initialize the default instance in such a way that it doesn't
  // conflict with other initialization.
  printer->Print("private static final $classname$ DEFAULT_INSTANCE;\n",
                 "classname",
                 name_resolver_->GetImmutableClassName(descriptor_));

  printer->Print(
      "static {\n"
      "  $classname$ defaultInstance = new $classname$();\n"
      "  // New instances are implicitly immutable so no need to make\n"
      "  // immutable.\n"
      "  DEFAULT_INSTANCE = defaultInstance;\n"
      // Register the default instance in a map. This map will be used by
      // experimental runtime to lookup default instance given a class instance
      // without using Java reflection.
      "  com.google.protobuf.GeneratedMessageLite.registerDefaultInstance(\n"
      "    $classname$.class, defaultInstance);\n"
      "}\n"
      "\n",
      "classname", descriptor_->name());

  printer->Print(
      "public static $classname$ getDefaultInstance() {\n"
      "  return DEFAULT_INSTANCE;\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  // 'of' method for Wrappers
  if (IsWrappersProtoFile(descriptor_->file())) {
    printer->Print(
        "public static $classname$ of($field_type$ value) {\n"
        "  return newBuilder().setValue(value).build();\n"
        "}\n"
        "\n",
        "classname", name_resolver_->GetImmutableClassName(descriptor_),
        "field_type", PrimitiveTypeName(GetJavaType(descriptor_->field(0))));
  }

  GenerateParser(printer);

  // Extensions must be declared after the DEFAULT_INSTANCE is initialized
  // because the DEFAULT_INSTANCE is used by the extension to lazily retrieve
  // the outer class's FileDescriptor.
  for (int i = 0; i < descriptor_->extension_count(); i++) {
    ImmutableExtensionLiteGenerator(descriptor_->extension(i), context_)
        .Generate(printer);
  }

  printer->Outdent();
  printer->Print("}\n\n");
}